

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall r_code::Code::Code(Code *this)

{
  Code *this_local;
  
  core::_Object::_Object(&this->super__Object);
  (this->super__Object)._vptr__Object = (_func_int **)&PTR__Code_002ea298;
  this->storage_index = -1;
  list<r_code::Code_*>::list(&this->markers);
  std::
  unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
  ::unordered_set(&this->views);
  list<r_code::Code_*>::reserve(&this->markers,8);
  return;
}

Assistant:

Code(): storage_index(null_storage_index)
    {
        markers.reserve(CodeMarkersInitialSize);
    }